

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

bool __thiscall c4::yml::Parser::_rval_dash_start_or_continue_seq(Parser *this)

{
  char *pcVar1;
  code *pcVar2;
  Location LVar3;
  Location LVar4;
  bool bVar5;
  undefined1 uVar6;
  size_t sVar7;
  char *pcVar8;
  State *pSVar9;
  ulong uVar10;
  char msg [39];
  char local_68 [72];
  
  sVar7 = LineContents::current_col
                    (&this->m_state->line_contents,(this->m_state->line_contents).rem);
  pSVar9 = this->m_state;
  uVar10 = pSVar9->indref;
  if (sVar7 < uVar10) {
    builtin_strncpy(local_68,"check failed: (ind >= m_state->indref)",0x27);
    if (((byte)s_error_flags & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar2 = (code *)swi(3);
        uVar6 = (*pcVar2)();
        return (bool)uVar6;
      }
    }
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x6f0e) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x6f0e) << 0x40,8);
    LVar3.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar3.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_68,0x27,LVar3,(this->m_stack).m_callbacks.m_user_data);
    pSVar9 = this->m_state;
    uVar10 = pSVar9->indref;
  }
  pSVar9->flags = pSVar9->flags & 0xfffffe7fU | 0x100;
  if (sVar7 == uVar10) {
    if ((pSVar9->line_contents).full.len <= sVar7) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar5 = is_debugger_attached();
        if (bVar5) {
          pcVar2 = (code *)swi(3);
          uVar6 = (*pcVar2)();
          return (bool)uVar6;
        }
      }
      handle_error(0x1f8007,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x14c3,"i >= 0 && i < len");
    }
    pcVar8 = (pSVar9->line_contents).full.str + sVar7;
    pcVar1 = (this->m_buf).str;
    if ((pcVar8 < pcVar1) || (pcVar1 + (this->m_buf).len < pcVar8)) {
      builtin_strncpy(local_68 + 0x30,"buf.end())",0xb);
      builtin_strncpy(local_68 + 0x10,"tr >= m_buf.begin() && str <= m_",0x20);
      builtin_strncpy(local_68,"check failed: (s",0x10);
      if (((byte)s_error_flags & 1) != 0) {
        bVar5 = is_debugger_attached();
        if (bVar5) {
          pcVar2 = (code *)swi(3);
          uVar6 = (*pcVar2)();
          return (bool)uVar6;
        }
      }
      LVar4.super_LineCol.col = 0;
      LVar4.super_LineCol.offset = SUB168(ZEXT816(0x5e95) << 0x40,0);
      LVar4.super_LineCol.line = SUB168(ZEXT816(0x5e95) << 0x40,8);
      LVar4.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar4.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_68,0x3b,LVar4,(this->m_stack).m_callbacks.m_user_data);
    }
    _append_val(this,(csubstr)ZEXT816(0),0);
  }
  else {
    _push_level(this,false);
    _start_seq(this,true);
    _save_indentation(this,0);
  }
  return sVar7 != uVar10;
}

Assistant:

bool Parser::_rval_dash_start_or_continue_seq()
{
    size_t ind = m_state->line_contents.current_col();
    _RYML_CB_ASSERT(m_stack.m_callbacks, ind >= m_state->indref);
    size_t delta_ind = ind - m_state->indref;
    if( ! delta_ind)
    {
        _c4dbgp("prev val was empty");
        addrem_flags(RNXT, RVAL);
        _append_val_null(&m_state->line_contents.full[ind]);
        return false;
    }
    _c4dbgp("val is a nested seq, indented");
    addrem_flags(RNXT, RVAL); // before _push_level!
    _push_level();
    _start_seq();
    _save_indentation();
    return true;
}